

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

Symbol __thiscall
google::protobuf::DescriptorBuilder::FindSymbolNotEnforcingDeps
          (DescriptorBuilder *this,string *name,bool build_it)

{
  _Rb_tree_header *p_Var1;
  byte bVar2;
  Symbol SVar3;
  _Base_ptr p_Var4;
  Symbol SVar5;
  _Base_ptr p_Var6;
  pair<std::_Rb_tree_iterator<const_google::protobuf::FileDescriptor_*>,_std::_Rb_tree_iterator<const_google::protobuf::FileDescriptor_*>_>
  pVar7;
  FileDescriptor *file;
  FileDescriptor *local_18;
  
  SVar3 = FindSymbolNotEnforcingDepsHelper(this,this->pool_,name,build_it);
  if (SVar3.ptr_ == (SymbolBase *)0x0) {
    local_18 = (FileDescriptor *)0x0;
  }
  else {
    bVar2 = (SVar3.ptr_)->symbol_type_;
    local_18 = (FileDescriptor *)0x0;
    if (bVar2 < 10) {
      SVar5 = SVar3;
      if ((0x296U >> (bVar2 & 0x1f) & 1) == 0) {
        if ((0x128U >> (bVar2 & 0x1f) & 1) == 0) goto LAB_00350a5c;
        SVar5.ptr_ = *(SymbolBase **)(SVar3.ptr_ + 0x10);
      }
      local_18 = *(FileDescriptor **)(SVar5.ptr_ + 0x10);
    }
  }
LAB_00350a5c:
  if (local_18 != this->file_) {
    p_Var4 = (this->dependencies_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var4 == (_Base_ptr)0x0) {
      return (Symbol)SVar3.ptr_;
    }
    p_Var1 = &(this->dependencies_)._M_t._M_impl.super__Rb_tree_header;
    p_Var6 = &p_Var1->_M_header;
    do {
      if (*(FileDescriptor **)(p_Var4 + 1) >= local_18) {
        p_Var6 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[*(FileDescriptor **)(p_Var4 + 1) < local_18];
    } while (p_Var4 != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)p_Var6 == p_Var1) {
      return (Symbol)SVar3.ptr_;
    }
    if (local_18 < *(FileDescriptor **)(p_Var6 + 1)) {
      return (Symbol)SVar3.ptr_;
    }
  }
  pVar7 = std::
          _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          ::equal_range(&(this->unused_dependency_)._M_t,&local_18);
  std::
  _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::_M_erase_aux(&(this->unused_dependency_)._M_t,(_Base_ptr)pVar7.first._M_node,
                 (_Base_ptr)pVar7.second._M_node);
  return (Symbol)SVar3.ptr_;
}

Assistant:

Symbol DescriptorBuilder::FindSymbolNotEnforcingDeps(const std::string& name,
                                                     bool build_it) {
  Symbol result = FindSymbolNotEnforcingDepsHelper(pool_, name, build_it);
  // Only find symbols which were defined in this file or one of its
  // dependencies.
  const FileDescriptor* file = result.GetFile();
  if (file == file_ || dependencies_.count(file) > 0) {
    unused_dependency_.erase(file);
  }
  return result;
}